

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprPhraseCollist(Fts5Expr *pExpr,int iPhrase,u8 **ppCollist,int *pnCollist)

{
  Fts5ExprPhrase *pFVar1;
  Fts5ExprNode *pFVar2;
  Fts5Buffer *pBuf;
  Fts5ExprTerm *pTerm;
  int rc;
  Fts5ExprNode *pNode;
  Fts5ExprPhrase *pPhrase;
  int *pnCollist_local;
  u8 **ppCollist_local;
  int iPhrase_local;
  Fts5Expr *pExpr_local;
  
  pFVar1 = pExpr->apExprPhrase[iPhrase];
  pFVar2 = pFVar1->pNode;
  pTerm._4_4_ = 0;
  if (((pFVar2->bEof == 0) && (pFVar2->iRowid == pExpr->pRoot->iRowid)) && (0 < (pFVar1->poslist).n)
     ) {
    if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
      *ppCollist = (pFVar1->aTerm[0].pIter)->pData;
      *pnCollist = (pFVar1->aTerm[0].pIter)->nData;
    }
    else {
      pTerm._4_4_ = fts5ExprSynonymList(pFVar1->aTerm,pFVar2->iRowid,
                                        (Fts5Buffer *)(pFVar1->aTerm[0].pSynonym + 1),ppCollist,
                                        pnCollist);
    }
  }
  else {
    *ppCollist = (u8 *)0x0;
    *pnCollist = 0;
  }
  return pTerm._4_4_;
}

Assistant:

static int sqlite3Fts5ExprPhraseCollist(
  Fts5Expr *pExpr, 
  int iPhrase, 
  const u8 **ppCollist, 
  int *pnCollist
){
  Fts5ExprPhrase *pPhrase = pExpr->apExprPhrase[iPhrase];
  Fts5ExprNode *pNode = pPhrase->pNode;
  int rc = SQLITE_OK;

  assert( iPhrase>=0 && iPhrase<pExpr->nPhrase );
  assert( pExpr->pConfig->eDetail==FTS5_DETAIL_COLUMNS );

  if( pNode->bEof==0 
   && pNode->iRowid==pExpr->pRoot->iRowid 
   && pPhrase->poslist.n>0
  ){
    Fts5ExprTerm *pTerm = &pPhrase->aTerm[0];
    if( pTerm->pSynonym ){
      Fts5Buffer *pBuf = (Fts5Buffer*)&pTerm->pSynonym[1];
      rc = fts5ExprSynonymList(
          pTerm, pNode->iRowid, pBuf, (u8**)ppCollist, pnCollist
      );
    }else{
      *ppCollist = pPhrase->aTerm[0].pIter->pData;
      *pnCollist = pPhrase->aTerm[0].pIter->nData;
    }
  }else{
    *ppCollist = 0;
    *pnCollist = 0;
  }

  return rc;
}